

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QComboBox::setIconSize(QComboBox *this,QSize *size)

{
  long lVar1;
  undefined4 in_EAX;
  QAbstractItemView *this_00;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  iVar3 = -(uint)((int)*(undefined8 *)(lVar1 + 0x308) == (*size).wd.m_i);
  iVar4 = -(uint)((int)((ulong)*(undefined8 *)(lVar1 + 0x308) >> 0x20) == (*size).ht.m_i);
  auVar2._4_4_ = iVar3;
  auVar2._0_4_ = iVar3;
  auVar2._8_4_ = iVar4;
  auVar2._12_4_ = iVar4;
  iVar3 = movmskpd(in_EAX,auVar2);
  if (iVar3 == 3) {
    return;
  }
  this_00 = (QAbstractItemView *)view(this);
  QAbstractItemView::setIconSize(this_00,size);
  *(QSize *)(lVar1 + 0x308) = *size;
  *(undefined8 *)(lVar1 + 0x318) = 0xffffffffffffffff;
  QWidget::updateGeometry(&this->super_QWidget);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }